

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::basic_csv_parser
          (basic_csv_parser<char,_std::allocator<char>_> *this,
          basic_csv_decode_options<char> *options,
          function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *alloc)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  pointer pcVar5;
  csv_mapping_kind cVar6;
  ulong uVar7;
  _func_int *p_Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  vector<jsoncons::csv::csv_type_info,_std::allocator<jsoncons::csv::csv_type_info>_> *local_48;
  double local_40;
  function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *local_38;
  
  (this->super_ser_context)._vptr_ser_context = (_func_int **)&PTR__basic_csv_parser_00b34af0;
  this->state_ = start;
  local_38 = &this->err_handler_;
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::function
            (local_38,err_handler);
  this->column_ = 1;
  this->line_ = 1;
  this->nesting_depth_ = 3;
  this->assume_header_ = (bool)(options->field_0x8 & 1);
  this->comment_starter_ = options->comment_starter_;
  pp_Var3 = options->_vptr_basic_csv_decode_options;
  this->field_delimiter_ = (&options->field_0x8)[(long)pp_Var3[-3]];
  uVar4 = options->header_lines_;
  uVar7 = 1;
  if (1 < uVar4) {
    uVar7 = uVar4;
  }
  if ((options->field_0x8 & 1) == 0) {
    uVar7 = uVar4;
  }
  this->header_lines_ = uVar7;
  this->ignore_empty_values_ = (bool)((byte)options->field_0x8 >> 1 & 1);
  this->ignore_empty_lines_ = (bool)((byte)options->field_0x8 >> 2 & 1);
  this->infer_types_ = (bool)(options->field_0x9 & 1);
  this->lossless_number_ = (bool)((byte)((ushort)*(undefined2 *)&options->field_0x8 >> 9) & 1);
  cVar6 = options->mapping_kind_;
  if ((cVar6 == 0) && (cVar6 = n_objects, (options->field_0x8 & 1) == 0)) {
    cVar6 = n_objects - (*(long *)(&options->field_0xd8 + (long)pp_Var3[-3]) == 0);
  }
  this->mapping_kind_ = cVar6;
  this->max_lines_ = options->max_lines_;
  this->quote_char_ = (&options->field_0x9)[(long)pp_Var3[-3]];
  this->quote_escape_char_ = (&options->comment_starter_)[(long)pp_Var3[-3]];
  this->subfield_delimiter_ = (&options->mapping_kind_)[(long)pp_Var3[-3]];
  this->trim_leading_ = (bool)((byte)options->field_0x8 >> 3 & 1);
  this->trim_leading_inside_quotes_ = (bool)((byte)options->field_0x8 >> 5 & 1);
  this->trim_trailing_ = (bool)((byte)options->field_0x8 >> 4 & 1);
  this->trim_trailing_inside_quotes_ = (bool)((byte)options->field_0x8 >> 6 & 1);
  this->unquoted_empty_value_is_null_ = (bool)((byte)options->field_0x8 >> 7);
  this->min_column_names_ = 0;
  this->column_index_ = 0;
  this->level_ = 0;
  this->depth_ = 0;
  this->offset_ = 0;
  jsoncons::detail::chars_to::chars_to(&this->to_double_);
  this->begin_input_ = (char *)0x0;
  this->input_end_ = (char *)0x0;
  this->input_ptr_ = (char *)0x0;
  this->more_ = true;
  this->header_line_ = 1;
  this->cursor_mode_ = false;
  this->actual_cursor_mode_ = false;
  this->mark_level_ = 0;
  this->header_line_offset_ = 0;
  (this->m_columns_filter_).super_basic_json_visitor<char>._vptr_basic_json_visitor =
       (_func_int **)&PTR__m_columns_filter_00b34b50;
  (this->m_columns_filter_).name_index_ = 0;
  (this->m_columns_filter_).level_ = 0;
  (this->m_columns_filter_).level2_ = 0;
  (this->m_columns_filter_).state_ = begin_object;
  local_50 = &this->column_names_;
  local_48 = &this->column_types_;
  memset(&(this->m_columns_filter_).column_index_,0,0xb8);
  (this->buffer_)._M_dataplus._M_p = (pointer)&(this->buffer_).field_2;
  (this->buffer_)._M_string_length = 0;
  (this->buffer_).field_2._M_local_buf[0] = '\0';
  this_00 = &this->string_double_map_;
  (this->string_double_map_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->string_double_map_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->string_double_map_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var8 = options->_vptr_basic_csv_decode_options[-3];
  uVar2 = *(ushort *)(&options->field_0xc + (long)p_Var8);
  if ((char)uVar2 < '\0') {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,*(long *)(&options->field_0x70 + (long)p_Var8),
               *(long *)(&options->field_0x78 + (long)p_Var8) +
               *(long *)(&options->field_0x70 + (long)p_Var8));
    local_40 = nan("");
    std::
    vector<std::pair<std::__cxx11::string,double>,std::allocator<std::pair<std::__cxx11::string,double>>>
    ::emplace_back<std::__cxx11::string,double>
              ((vector<std::pair<std::__cxx11::string,double>,std::allocator<std::pair<std::__cxx11::string,double>>>
                *)this_00,&local_70,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    p_Var8 = options->_vptr_basic_csv_decode_options[-3];
    uVar2 = *(ushort *)(&options->field_0xc + (long)p_Var8);
  }
  if ((uVar2 >> 8 & 1) != 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,*(long *)(&options->field_0x90 + (long)p_Var8),
               *(long *)(&options->field_0x98 + (long)p_Var8) +
               *(long *)(&options->field_0x90 + (long)p_Var8));
    local_40 = INFINITY;
    std::
    vector<std::pair<std::__cxx11::string,double>,std::allocator<std::pair<std::__cxx11::string,double>>>
    ::emplace_back<std::__cxx11::string,double>
              ((vector<std::pair<std::__cxx11::string,double>,std::allocator<std::pair<std::__cxx11::string,double>>>
                *)this_00,&local_70,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    p_Var8 = options->_vptr_basic_csv_decode_options[-3];
    uVar2 = *(ushort *)(&options->field_0xc + (long)p_Var8);
  }
  if ((uVar2 & 0x300) != 0) {
    basic_csv_options_common<char>::neginf_to_str_abi_cxx11_
              (&local_70,
               (basic_csv_options_common<char> *)
               ((long)&options->_vptr_basic_csv_decode_options + (long)p_Var8));
    local_40 = -INFINITY;
    std::
    vector<std::pair<std::__cxx11::string,double>,std::allocator<std::pair<std::__cxx11::string,double>>>
    ::emplace_back<std::__cxx11::string,double>
              ((vector<std::pair<std::__cxx11::string,double>,std::allocator<std::pair<std::__cxx11::string,double>>>
                *)this_00,&local_70,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  paVar1 = &local_70.field_2;
  pcVar5 = (options->column_types_)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar5,pcVar5 + (options->column_types_)._M_string_length);
  detail::
  parse_column_types<char,std::vector<jsoncons::csv::csv_type_info,std::allocator<jsoncons::csv::csv_type_info>>>
            (&local_70,local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = (options->column_defaults_)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar5,pcVar5 + (options->column_defaults_)._M_string_length);
  detail::
  parse_column_names<char,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_70,&this->column_defaults_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  detail::
  parse_column_names<char,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (&options->field_0xd0 + (long)options->_vptr_basic_csv_decode_options[-3]),local_50);
  this->min_column_names_ =
       (long)(this->column_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->column_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  initialize(this);
  return;
}

Assistant:

basic_csv_parser(const basic_csv_decode_options<CharT>& options,
                     std::function<bool(csv_errc,const ser_context&)> err_handler,
                     const TempAllocator& alloc = TempAllocator())
       : alloc_(alloc),
         state_(csv_parse_state::start),
         err_handler_(err_handler),
         assume_header_(options.assume_header()),                  
         comment_starter_(options.comment_starter()),
         field_delimiter_(options.field_delimiter()),
         header_lines_(options.header_lines()),
         ignore_empty_values_(options.ignore_empty_values()),
         ignore_empty_lines_(options.ignore_empty_lines()),
         infer_types_(options.infer_types()),
         lossless_number_(options.lossless_number()), 
         mapping_kind_(options.mapping_kind()),
         max_lines_(options.max_lines()),
         quote_char_(options.quote_char()),
         quote_escape_char_(options.quote_escape_char()),
         subfield_delimiter_(options.subfield_delimiter()),
         trim_leading_(options.trim_leading()),
         trim_leading_inside_quotes_(options.trim_leading_inside_quotes()),
         trim_trailing_(options.trim_trailing()),
         trim_trailing_inside_quotes_(options.trim_trailing_inside_quotes()),
         unquoted_empty_value_is_null_(options.unquoted_empty_value_is_null()),
         m_columns_filter_(alloc),
         stack_(alloc),
         column_names_(alloc),
         column_types_(alloc),
         column_defaults_(alloc),
         state_stack_(alloc),
         buffer_(alloc)
    {
        if (options.enable_str_to_nan())
        {
            string_double_map_.emplace_back(options.nan_to_str(),std::nan(""));
        }
        if (options.enable_str_to_inf())
        {
            string_double_map_.emplace_back(options.inf_to_str(),std::numeric_limits<double>::infinity());
        }
        if (options.enable_str_to_neginf())
        {
            string_double_map_.emplace_back(options.neginf_to_str(),-std::numeric_limits<double>::infinity());
        }

        jsoncons::csv::detail::parse_column_types(options.column_types(), column_types_);
        jsoncons::csv::detail::parse_column_names(options.column_defaults(), column_defaults_);
        jsoncons::csv::detail::parse_column_names(options.column_names(), column_names_);
        min_column_names_ = column_names_.size();
        initialize();
    }